

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnp.cpp
# Opt level: O3

int rs1LinProjection(Vector3d *X,Vector2d *u,Vector3d *v,Vector3d *C,Vector3d *w,Vector3d *t,
                    double f,double rd,double r0,int direction)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  int iVar5;
  ActualDstType actualDst;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  double dVar8;
  double dVar12;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  Matrix3d K;
  double local_208;
  double dStack_200;
  Vector3d *local_1e8;
  double local_1e0 [7];
  double dStack_1a8;
  double local_1a0;
  double local_198;
  double local_188;
  double dStack_180;
  double dStack_178;
  double local_170;
  double dStack_168;
  double local_160;
  double dStack_158;
  double local_150;
  double local_148 [5];
  double *pdStack_120;
  double dStack_118;
  double local_110;
  double dStack_108;
  double dStack_100;
  double local_f8;
  undefined1 local_c8 [16];
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  double dStack_a0;
  Vector3d local_98;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double dStack_58;
  double local_50;
  double local_48;
  double dStack_40;
  double local_38;
  
  local_1e0[6] = 0.0;
  dStack_1a8 = 0.0;
  local_170 = 0.0;
  local_160 = 0.0;
  dStack_158 = 0.0;
  dStack_180 = 0.0;
  dStack_178 = 0.0;
  local_150 = 0.0;
  local_148[0] = 1.0;
  auVar11 = *(undefined1 (*) [16])
             (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
             array;
  dVar19 = (v->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
           [2];
  auVar6._0_8_ = dVar19 * dVar19 + auVar11._8_8_ * auVar11._8_8_ + auVar11._0_8_ * auVar11._0_8_;
  auVar6._8_8_ = 0;
  auVar6 = sqrtpd(auVar6,auVar6);
  dVar8 = auVar6._0_8_;
  local_1e8 = t;
  local_1e0[0] = rd;
  local_188 = f;
  dStack_168 = f;
  if (1e-15 <= dVar8) {
    auVar9._8_8_ = dVar8;
    auVar9._0_8_ = dVar8;
    auVar11 = divpd(auVar11,auVar9);
    local_b8 = dVar19 / dVar8;
    uStack_b0 = 0;
    local_c8 = auVar6;
    dVar19 = sin(dVar8);
    local_208 = auVar11._0_8_;
    dStack_200 = auVar11._8_8_;
    local_a8 = dVar19 * local_208;
    dStack_a0 = dVar19 * dStack_200;
    local_1e0[5] = cos((double)local_c8._0_8_);
    dVar8 = 1.0 - local_1e0[5];
    dVar12 = dVar8 * local_208;
    local_1e0[6] = dVar8 * dStack_200 * local_b8;
    local_1a0 = local_1e0[6] - local_a8;
    local_1e0[3] = dVar12 * local_b8 - dStack_a0;
    local_1e0[6] = local_1e0[6] + local_a8;
    dStack_1a8 = dVar12 * local_b8 + dStack_a0;
    local_198 = local_b8 * dVar8 * local_b8 + local_1e0[5];
    local_1e0[1] = local_1e0[5] + dVar12 * local_208;
    local_1e0[2] = dVar19 * local_b8 + dVar12 * dStack_200;
    local_1e0[4] = dVar12 * dStack_200 - dVar19 * local_b8;
    local_1e0[5] = local_1e0[5] + dVar8 * dStack_200 * dStack_200;
  }
  else {
    local_1e0[1] = 1.0;
    local_1e0[2] = 0.0;
    local_1e0[3] = 0.0;
    local_1e0[4] = 0.0;
    local_1e0[5] = 1.0;
    local_198 = 1.0;
    local_1a0 = 0.0;
  }
  dVar19 = (X->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
           [0];
  dVar8 = (X->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [1];
  dVar12 = (X->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
           [2];
  local_148[2] = (C->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                 array[0] + dVar12 * dStack_1a8 + dVar8 * local_1e0[4] + dVar19 * local_1e0[1];
  local_148[3] = (C->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                 array[1] + dVar12 * local_1a0 + dVar8 * local_1e0[5] + dVar19 * local_1e0[2];
  local_148[4] = local_1e0[3] * dVar19 + local_198 * dVar12 + local_1e0[6] * dVar8 +
                 (C->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                 array[2];
  auVar16._0_8_ = local_148[4] * 0.0 + local_148[3] * local_170 + local_148[2] * local_188;
  auVar16._8_8_ = local_148[4] * 0.0 + local_148[3] * dStack_168 + local_148[2] * dStack_180;
  dVar19 = local_148[3] * 0.0 + local_148[4] + local_148[2] * 0.0;
  auVar11._8_8_ = dVar19;
  auVar11._0_8_ = dVar19;
  auVar17 = divpd(auVar16,auVar11);
  *(undefined1 (*) [16])
   (u->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array =
       auVar17;
  dVar19 = 1e+15;
  iVar5 = 0;
  do {
    if (dVar19 <= 1e-10) {
      return 0;
    }
    local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = (u->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
           [direction];
    local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = (w->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
           [0] * local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
    local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = (w->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
           [1] * local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
    local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = local_98.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] *
           (w->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
           [2];
    X_(&local_98);
    dVar19 = (u->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
             array[direction];
    dVar8 = local_78 + 1.0;
    dVar12 = dStack_70 + 0.0;
    dVar15 = dStack_60 + 0.0;
    dVar18 = dStack_58 + 1.0;
    dVar13 = local_68 + 0.0;
    dVar14 = local_50 + 0.0;
    dVar20 = local_48 + 0.0;
    dVar21 = dStack_40 + 0.0;
    dVar22 = local_38 + 1.0;
    lVar4 = 0x10;
    do {
      dVar1 = *(double *)((long)local_1e0 + lVar4 + 8);
      dVar2 = *(double *)((long)&local_1e8 + lVar4);
      dVar3 = *(double *)((long)local_1e0 + lVar4);
      *(double *)((long)local_148 + lVar4) = dVar3 * dVar15 + dVar2 * dVar8 + dVar1 * dVar20;
      *(double *)((long)local_148 + lVar4 + 8) = dVar3 * dVar18 + dVar2 * dVar12 + dVar1 * dVar21;
      *(double *)((long)local_148 + lVar4 + 0x10) = dVar14 * dVar3 + dVar1 * dVar22 + dVar13 * dVar2
      ;
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x58);
    dVar8 = (X->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
            [0];
    dVar12 = (X->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
             array[1];
    dVar13 = (X->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
             array[2];
    local_148[2] = (local_1e8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                   m_storage.m_data.array[0] * dVar19 +
                   (C->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                   m_data.array[0] +
                   dVar13 * dStack_108 + (double)pdStack_120 * dVar12 + dVar8 * local_148[2];
    local_148[3] = (local_1e8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                   m_storage.m_data.array[1] * dVar19 +
                   (C->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                   m_data.array[1] +
                   dVar13 * dStack_100 + dStack_118 * dVar12 + dVar8 * local_148[3];
    local_148[4] = dVar19 * (local_1e8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                            ).m_storage.m_data.array[2] +
                   local_f8 * dVar13 + local_110 * dVar12 + dVar8 * local_148[4] +
                   (C->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                   m_data.array[2];
    pdStack_120 = &local_188;
    auVar10._0_8_ = local_148[4] * dStack_158 + local_148[3] * local_170 + local_148[2] * local_188;
    auVar10._8_8_ = local_148[4] * local_150 + local_148[3] * dStack_168 + local_148[2] * dStack_180
    ;
    auVar7._0_8_ = local_148[4] * local_148[0] + local_148[3] * local_160 +
                   dStack_178 * local_148[2];
    auVar7._8_8_ = auVar7._0_8_;
    auVar11 = divpd(auVar10,auVar7);
    local_208 = auVar17._0_8_;
    dVar19 = (local_208 * local_208 + auVar17._8_8_ * auVar17._8_8_) * local_1e0[0] + 1.0;
    auVar17._0_8_ = dVar19 * auVar11._0_8_;
    auVar17._8_8_ = dVar19 * auVar11._8_8_;
    dVar19 = (u->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.
             array[0] - auVar17._0_8_;
    dVar8 = (u->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array
            [1] - auVar17._8_8_;
    dVar19 = SQRT(dVar8 * dVar8 + dVar19 * dVar19);
    *(undefined1 (*) [16])
     (u->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.m_data.array =
         auVar17;
    iVar5 = iVar5 + 1;
  } while (iVar5 != 0x66);
  return 2;
}

Assistant:

int rs1LinProjection(const Eigen::Vector3d &X, Eigen::Vector2d &u, const Eigen::Vector3d &v, const Eigen::Vector3d &C, const Eigen::Vector3d &w, const Eigen::Vector3d &t, double f, double rd, double r0, int direction){
    Eigen::Matrix<double,3,4> P;
    Eigen::Vector3d uh;
    Eigen::Matrix3d K = Eigen::Matrix3d::Zero();
    K.diagonal() << f, f, 1;
    // Eigen::Matrix3d Rv = Eigen::Matrix3d::Identity() + X_(v); 
    Eigen::Matrix3d Rv;
    double n = v.norm();
    if(n < 1e-15){
        Rv = Eigen::AngleAxis<double>(0, (Eigen::Vector3d() << 1,0,0).finished()).toRotationMatrix();
    }else{
        Rv = Eigen::AngleAxis<double>(n, v/n).toRotationMatrix();
    }

    uh = K* ( Rv * X + C );
    u = uh.head(2)/uh(2);

    double diff = 1e15;

    int niter = 0;
    
    Eigen::Vector3d temp;

    while(diff > 1e-10 ){
        double rc2 = u(0)*u(0) + u(1)*u(1);
        temp = K * ((Eigen::Matrix3d::Identity() + X_(u(direction) * w)) * Rv * X + C + u(direction) * t);
        temp = temp/temp(2);
        temp.head(2) *= (1 + rd * rc2);
        diff = (u - temp.head(2)).norm();
        u = temp.head(2);
        if(niter > 100){
            return WARN_NO_CONVERGENCE;
        }
        niter++;
    }


    return 0;

}